

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

uint xmlXPathNodeValHash(xmlNodePtr node)

{
  byte bVar1;
  xmlElementType xVar2;
  _xmlNode *p_Var3;
  xmlNodePtr pxVar4;
  xmlChar *pxVar5;
  _xmlNode *p_Var6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  
  uVar9 = 0;
  uVar8 = 0;
  if (node != (xmlNodePtr)0x0) {
    pxVar4 = node;
    if (node->type == XML_DOCUMENT_NODE) {
      pxVar4 = xmlDocGetRootElement((xmlDoc *)node);
      if (pxVar4 == (xmlNodePtr)0x0) {
        pxVar4 = node->children;
      }
      if (pxVar4 == (xmlNodePtr)0x0) {
        return 0;
      }
    }
    xVar2 = pxVar4->type;
    uVar8 = uVar9;
    if (xVar2 < XML_XINCLUDE_START) {
      if ((0x198U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
        if ((6U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
          p_Var6 = pxVar4->children;
          if (p_Var6 == (xmlNodePtr)0x0) {
            return 0;
          }
          iVar7 = 2;
          uVar8 = 0;
          do {
            xVar2 = p_Var6->type;
            if (xVar2 - XML_TEXT_NODE < 2) {
              pbVar10 = p_Var6->content;
            }
            else {
              pbVar10 = (byte *)0x0;
            }
            uVar9 = uVar8;
            if ((pbVar10 != (byte *)0x0) && (bVar1 = *pbVar10, bVar1 != 0)) {
              uVar9 = (uint)bVar1;
              if (iVar7 == 1) {
                return (uint)bVar1 * 0x100 + uVar8;
              }
              iVar7 = 1;
              if (pbVar10[1] != 0) {
                return (uint)CONCAT11(pbVar10[1],bVar1);
              }
            }
            p_Var3 = p_Var6->children;
            if ((((p_Var3 == (_xmlNode *)0x0) || (xVar2 == XML_ENTITY_REF_NODE)) ||
                (xVar2 == XML_DTD_NODE)) || (p_Var3->type == XML_ENTITY_DECL)) {
              if (p_Var6 == pxVar4) {
                return uVar9;
              }
              do {
                p_Var3 = p_Var6->next;
                if (p_Var6->next != (_xmlNode *)0x0) break;
                p_Var6 = p_Var6->parent;
                if (p_Var6 == (_xmlNode *)0x0) {
                  p_Var3 = (_xmlNode *)0x0;
                  break;
                }
                p_Var3 = (_xmlNode *)0x0;
              } while (p_Var6 != pxVar4);
            }
            p_Var6 = p_Var3;
            uVar8 = uVar9;
            if (p_Var6 == (_xmlNode *)0x0) {
              return uVar9;
            }
          } while( true );
        }
        if (xVar2 != XML_NAMESPACE_DECL) {
          return 0;
        }
        pxVar5 = pxVar4->name;
      }
      else {
        pxVar5 = pxVar4->content;
      }
      if ((pxVar5 != (xmlChar *)0x0) && (*pxVar5 != '\0')) {
        uVar8 = (uint)CONCAT11(pxVar5[1],*pxVar5);
      }
    }
  }
  return uVar8;
}

Assistant:

static unsigned int
xmlXPathNodeValHash(xmlNodePtr node) {
    int len = 2;
    const xmlChar * string = NULL;
    xmlNodePtr tmp = NULL;
    unsigned int ret = 0;

    if (node == NULL)
	return(0);

    if (node->type == XML_DOCUMENT_NODE) {
	tmp = xmlDocGetRootElement((xmlDocPtr) node);
	if (tmp == NULL)
	    node = node->children;
	else
	    node = tmp;

	if (node == NULL)
	    return(0);
    }

    switch (node->type) {
	case XML_COMMENT_NODE:
	case XML_PI_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_TEXT_NODE:
	    string = node->content;
	    if (string == NULL)
		return(0);
	    if (string[0] == 0)
		return(0);
	    return(string[0] + (string[1] << 8));
	case XML_NAMESPACE_DECL:
	    string = ((xmlNsPtr)node)->href;
	    if (string == NULL)
		return(0);
	    if (string[0] == 0)
		return(0);
	    return(string[0] + (string[1] << 8));
	case XML_ATTRIBUTE_NODE:
	    tmp = ((xmlAttrPtr) node)->children;
	    break;
	case XML_ELEMENT_NODE:
	    tmp = node->children;
	    break;
	default:
	    return(0);
    }
    while (tmp != NULL) {
	switch (tmp->type) {
	    case XML_CDATA_SECTION_NODE:
	    case XML_TEXT_NODE:
		string = tmp->content;
		break;
	    default:
                string = NULL;
		break;
	}
	if ((string != NULL) && (string[0] != 0)) {
	    if (len == 1) {
		return(ret + (string[0] << 8));
	    }
	    if (string[1] == 0) {
		len = 1;
		ret = string[0];
	    } else {
		return(string[0] + (string[1] << 8));
	    }
	}
	/*
	 * Skip to next node
	 */
        if ((tmp->children != NULL) &&
            (tmp->type != XML_DTD_NODE) &&
            (tmp->type != XML_ENTITY_REF_NODE) &&
            (tmp->children->type != XML_ENTITY_DECL)) {
            tmp = tmp->children;
            continue;
	}
	if (tmp == node)
	    break;

	if (tmp->next != NULL) {
	    tmp = tmp->next;
	    continue;
	}

	do {
	    tmp = tmp->parent;
	    if (tmp == NULL)
		break;
	    if (tmp == node) {
		tmp = NULL;
		break;
	    }
	    if (tmp->next != NULL) {
		tmp = tmp->next;
		break;
	    }
	} while (tmp != NULL);
    }
    return(ret);
}